

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_internal<long_double>
                 (size_t cnt,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  double dVar1;
  float fVar2;
  size_t iternum;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar9;
  longdouble lVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  UniformUnitInterval runif;
  size_t ntry;
  UniformUnitInterval local_d1;
  double local_d0;
  int local_c8;
  longdouble local_c4;
  longdouble local_b8;
  longdouble local_ac;
  longdouble local_a0;
  longdouble local_94;
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  size_t local_68;
  ulong local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_60 = cnt - buffer_cnt[ncat];
  dVar12 = -INFINITY;
  if (1 < local_60) {
    fVar2 = (float)(&DAT_0036b0d8)[(long)local_60 < 0];
    uVar5 = (ulong)(uint)ncat;
    if (0 < ncat) {
      uVar4 = 0;
      do {
        local_68 = buffer_cnt[uVar4];
        buffer_prob[uVar4] =
             (double)(((float)(long)local_68 + (float)(&DAT_0036b0d8)[(long)local_68 < 0]) /
                     ((float)(long)local_60 + fVar2));
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    if (cat_split_type == SubSet) {
      local_d0 = 0.0;
      local_88 = 0x32;
      lVar3 = 0;
      local_54 = -(longdouble)0;
      local_c8 = ncat;
      do {
        local_ac = (longdouble)0;
        local_b8 = local_ac;
        lVar6 = local_ac;
        local_c4 = local_54;
        if (0 < ncat) {
          uVar4 = 0;
          lVar8 = in_ST2;
          lVar7 = in_ST2;
          local_c4 = local_ac;
          do {
            local_3c = lVar6;
            local_70 = Xoshiro::UniformUnitInterval::operator()(&local_d1,rnd_generator);
            local_48 = (longdouble)local_70;
            local_94 = local_48 * local_48;
            local_a0 = (longdouble)buffer_prob[uVar4];
            lVar6 = in_ST2;
            lVar10 = lVar7;
            lVar9 = lVar7;
            in_ST2 = lVar7;
            fmal();
            local_ac = in_ST0;
            fmal();
            in_ST0 = lVar7;
            lVar7 = in_ST2;
            local_b8 = in_ST1;
            fmal();
            in_ST1 = lVar10;
            local_c4 = lVar8;
            fmal();
            uVar4 = uVar4 + 1;
            lVar8 = lVar9;
          } while (uVar5 != uVar4);
          local_c4 = local_c4 * (longdouble)-4.0;
          ncat = local_c8;
        }
        lVar7 = local_ac * local_ac;
        lVar8 = local_b8 - lVar7;
        if (lVar8 <= (longdouble)0) {
          local_88 = local_88 + -1;
        }
        else {
          local_78 = local_d0;
          local_d0 = (double)((local_ac * lVar7 * local_ac +
                              local_ac * (longdouble)-4.0 * lVar7 * local_ac +
                              local_b8 * (longdouble)6.0 * lVar7 + local_c4 * local_ac + lVar6) /
                              (lVar8 * lVar8) + (longdouble)local_d0);
          local_80 = local_d0;
        }
        lVar3 = lVar3 + 1;
        in_ST1 = in_ST0;
        in_ST2 = in_ST0;
      } while (lVar3 != 0x32);
      dVar12 = -INFINITY;
      if ((local_88 != 0) && ((ulong)ABS(local_d0) < 0x7ff0000000000000)) {
        auVar13._8_4_ = (int)((ulong)local_88 >> 0x20);
        auVar13._0_8_ = local_88;
        auVar13._12_4_ = 0x45300000;
        if (local_d0 <= 0.0) {
          local_d0 = 0.0;
        }
        dVar12 = local_d0 /
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_88) - 4503599627370496.0));
      }
    }
    else {
      if (ncat < 1) {
        dVar11 = 0.0;
      }
      else {
        uVar4 = 0;
        dVar11 = 0.0;
        do {
          dVar1 = buffer_prob[uVar4];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            dVar14 = dVar1 * dVar1;
            dVar11 = dVar11 + (dVar1 * dVar14 * dVar1 +
                              dVar1 * -4.0 * dVar1 * dVar14 +
                              dVar1 * 6.0 * dVar14 + dVar1 * -4.0 * dVar1 + dVar1) /
                              ((dVar1 - dVar14) * (dVar1 - dVar14));
          }
          else {
            ncat = ncat + -1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      if ((1 < ncat) && ((ulong)ABS(dVar11) < 0x7ff0000000000000)) {
        if (dVar11 <= 0.0) {
          dVar11 = 0.0;
        }
        dVar12 = dVar11 / (double)ncat;
      }
    }
  }
  return dVar12;
}

Assistant:

double calc_kurtosis_internal(size_t cnt, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    /* This calculation proceeds as follows:
        - If splitting by subsets, it will assign a random weight ~Unif(0,1) to
          each category, and approximate kurtosis by sampling from such distribution
          with the same probabilities as given by the current counts.
        - If splitting by isolating one category, will binarize at each categorical level,
          assume the values are zero or one, and output the average assuming each categorical
          level has equal probability of being picked.
        (Note that both are misleading heuristics, but might be better than random)
    */
    double sum_kurt = 0;

    cnt -= buffer_cnt[ncat];
    if (cnt <= 1) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    for (int cat = 0; cat < ncat; cat++)
        buffer_prob[cat] = buffer_cnt[cat] / cnt_l;

    switch (cat_split_type)
    {
        case SubSet:
        {
            ldouble_safe temp_v;
            ldouble_safe s1, s2, s3, s4;
            ldouble_safe coef;
            ldouble_safe coef2;
            ldouble_safe w_this;
            UniformUnitInterval runif(0, 1);
            size_t ntry = 50;
            for (size_t iternum = 0; iternum < 50; iternum++)
            {
                s1 = 0; s2 = 0; s3 = 0; s4 = 0;
                for (int cat = 0; cat < ncat; cat++)
                {
                    coef = runif(rnd_generator);
                    coef2 = coef * coef;
                    w_this = buffer_prob[cat];
                    s1 = std::fma(w_this, coef, s1);
                    s2 = std::fma(w_this, coef2, s2);
                    s3 = std::fma(w_this, coef2*coef, s3);
                    s4 = std::fma(w_this, coef2*coef2, s4);
                    // s1 += buffer_prob[cat] * pw1(coef);
                    // s2 += buffer_prob[cat] * pw2(coef);
                    // s3 += buffer_prob[cat] * pw3(coef);
                    // s4 += buffer_prob[cat] * pw4(coef);
                }
                temp_v = s2 - pw2(s1);
                if (temp_v <= 0)
                    ntry--;
                else
                    sum_kurt += (s4 - 4 * s3 * pw1(s1) + 6 * s2 * pw2(s1) - 4 * s1 * pw3(s1) + pw4(s1)) / pw2(temp_v);
            }
            if (unlikely(!ntry))
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ntry;
        }

        case SingleCateg:
        {
            double p;
            int ncat_present = ncat;
            for (int cat = 0; cat < ncat; cat++)
            {
                p = buffer_prob[cat];
                if (p == 0)
                    ncat_present--;
                else
                    sum_kurt += (p - 4 * p * pw1(p) + 6 * p * pw2(p) - 4 * p * pw3(p) + pw4(p)) / pw2(p - pw2(p));
            }
            if (ncat_present <= 1)
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ncat_present;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}